

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

void __thiscall QGraphicsWidgetPrivate::updateFont(QGraphicsWidgetPrivate *this,QFont *font)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  QGraphicsWidget *pQVar4;
  qsizetype qVar5;
  const_reference ppQVar6;
  QGraphicsWidgetPrivate *pQVar7;
  QGraphicsItemPrivate *pQVar8;
  QFont *in_RSI;
  QGraphicsWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsWidget *w;
  QGraphicsItem *item;
  int i;
  int mask;
  QGraphicsWidget *q;
  QEvent event;
  QGraphicsLayoutItem *in_stack_ffffffffffffff98;
  QGraphicsWidget *in_stack_ffffffffffffffa0;
  QGraphicsWidget *this_00;
  int local_38;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  QFont::operator=(&in_RDI->font,in_RSI);
  bVar1 = QGraphicsItem::isWindow((QGraphicsItem *)in_RDI);
  if ((bVar1) &&
     (bVar1 = QGraphicsWidget::testAttribute
                        (in_stack_ffffffffffffffa0,
                         (WidgetAttribute)((ulong)in_stack_ffffffffffffff98 >> 0x20)), !bVar1)) {
    in_RDI->inheritedFontResolveMask = 0;
  }
  uVar2 = QFont::resolveMask(in_RSI);
  uVar3 = uVar2 | in_RDI->inheritedFontResolveMask;
  for (local_38 = 0;
      qVar5 = QList<QGraphicsItem_*>::size(&(in_RDI->super_QGraphicsItemPrivate).children),
      local_38 < qVar5; local_38 = local_38 + 1) {
    ppQVar6 = QList<QGraphicsItem_*>::at
                        ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffffa0,
                         (qsizetype)in_stack_ffffffffffffff98);
    this_00 = (QGraphicsWidget *)*ppQVar6;
    bVar1 = QGraphicsItem::isWidget((QGraphicsItem *)0xa56c75);
    if (bVar1) {
      if (this_00 == (QGraphicsWidget *)0x0) {
        in_stack_ffffffffffffff98 = (QGraphicsLayoutItem *)0x0;
      }
      else {
        in_stack_ffffffffffffff98 = &this_00[-1].super_QGraphicsLayoutItem;
      }
      bVar1 = QGraphicsItem::isWindow((QGraphicsItem *)in_RDI);
      if ((!bVar1) ||
         (bVar1 = QGraphicsWidget::testAttribute
                            (this_00,(WidgetAttribute)((ulong)in_stack_ffffffffffffff98 >> 0x20)),
         bVar1)) {
        pQVar7 = QGraphicsWidget::d_func((QGraphicsWidget *)0xa56cde);
        (*(pQVar7->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate[5])(pQVar7,(ulong)uVar3);
      }
    }
    else {
      pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&(this_00->super_QGraphicsObject).field_0x8);
      (*pQVar8->_vptr_QGraphicsItemPrivate[5])(pQVar8,(ulong)uVar3);
      this_00 = in_stack_ffffffffffffffa0;
    }
    in_stack_ffffffffffffffa0 = this_00;
  }
  if ((*(ushort *)&in_RDI->field_0x1b4 >> 0xb & 1) != 0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_18,FontChange);
    QCoreApplication::sendEvent((QObject *)pQVar4,(QEvent *)&local_18);
    QEvent::~QEvent((QEvent *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidgetPrivate::updateFont(const QFont &font)
{
    Q_Q(QGraphicsWidget);
    // Update the local font setting.
    this->font = font;

    // Calculate new mask.
    if (q->isWindow() && !q->testAttribute(Qt::WA_WindowPropagation))
        inheritedFontResolveMask = 0;
    int mask = font.resolveMask() | inheritedFontResolveMask;

    // Propagate to children.
    for (int i = 0; i < children.size(); ++i) {
        QGraphicsItem *item = children.at(i);
        if (item->isWidget()) {
            QGraphicsWidget *w = static_cast<QGraphicsWidget *>(item);
            if (!w->isWindow() || w->testAttribute(Qt::WA_WindowPropagation))
                w->d_func()->resolveFont(mask);
        } else {
            item->d_ptr->resolveFont(mask);
        }
    }

    if (!polished)
        return;
    // Notify change.
    QEvent event(QEvent::FontChange);
    QCoreApplication::sendEvent(q, &event);
}